

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O2

void __thiscall
QueryTests_SelectDataSetWithCriteria_canDetermineSpecificationForSelectDataSetWithCriteria_Test::
~QueryTests_SelectDataSetWithCriteria_canDetermineSpecificationForSelectDataSetWithCriteria_Test
          (QueryTests_SelectDataSetWithCriteria_canDetermineSpecificationForSelectDataSetWithCriteria_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(QueryTests_SelectDataSetWithCriteria,canDetermineSpecificationForSelectDataSetWithCriteria)
{
  database::Query query_select_dataset_with_criteria1 = "select employee_id,employee_name from company.employee where employee_id = 1";
  ASSERT_TRUE(query_select_dataset_with_criteria1.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria1.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria1.containerName() == "employee");
  std::vector<std::string> expected_dataset1 = {"employee_id","employee_name"};
  ASSERT_TRUE(query_select_dataset_with_criteria1.dataset() == expected_dataset1);
  database::api_filter_type filter1 = {
    {"employee_id",{{"1",database::equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria1.filter() == filter1);

  database::Query query_select_dataset_with_criteria2 = "select employee_name from company.employee where employee_status = fulltime and employee_department <> sales";
  ASSERT_TRUE(query_select_dataset_with_criteria2.transactionType() == database::select_dataset);
  ASSERT_TRUE(query_select_dataset_with_criteria2.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria2.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria2.containerName() == "employee");
  std::vector<std::string> expected_dataset2 = {"employee_name"};
  ASSERT_TRUE(query_select_dataset_with_criteria2.dataset() == expected_dataset2);
  database::api_filter_type filter2 = {
    {"employee_status",{{"fulltime",database::equal_to}}},
    {"employee_department",{{"sales",database::not_equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria2.filter() == filter2);

  database::Query query_select_dataset_with_criteria3 = "select employee_id,employee_name,employee_status from company.employee where employee_join_date >= 20170912 and employee_join_date <= 20180101";
  ASSERT_TRUE(query_select_dataset_with_criteria3.transactionType() == database::select_dataset);
  ASSERT_TRUE(query_select_dataset_with_criteria3.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria3.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria3.containerName() == "employee");
  std::vector<std::string> expected_dataset3 = {"employee_id","employee_name","employee_status"};
  ASSERT_TRUE(query_select_dataset_with_criteria3.dataset() == expected_dataset3);
  database::api_filter_type filter3 = {
    {"employee_join_date",{{"20170912",database::greater_or_equal_to},{"20180101",database::lesser_or_equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria3.filter() == filter3);
}